

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O3

string * SoapySDR::getRootPath_abi_cxx11_(void)

{
  string *in_RDI;
  string rootPathEnv;
  string local_30;
  
  getEnvImpl_abi_cxx11_(&local_30,"SOAPY_SDR_ROOT");
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (local_30._M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    std::__cxx11::string::_M_construct<char*>();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string SoapySDR::getRootPath(void)
{
    const std::string rootPathEnv = getEnvImpl("SOAPY_SDR_ROOT");
    if (not rootPathEnv.empty()) return rootPathEnv;

    // Get the path to the current dynamic linked library.
    // The path to this library can be used to determine
    // the installation root without prior knowledge.
    #ifdef _MSC_VER
    char path[MAX_PATH];
    HMODULE hm = NULL;
    if (GetModuleHandleExA(
        GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS |
        GET_MODULE_HANDLE_EX_FLAG_UNCHANGED_REFCOUNT,
        (LPCSTR) &SoapySDR::getRootPath, &hm))
    {
        const DWORD size = GetModuleFileNameA(hm, path, sizeof(path));
        if (size != 0)
        {
            const std::string libPath(path, size);
            const size_t slash0Pos = libPath.find_last_of("/\\");
            const size_t slash1Pos = libPath.substr(0, slash0Pos).find_last_of("/\\");
            if (slash0Pos != std::string::npos and slash1Pos != std::string::npos)
                return libPath.substr(0, slash1Pos);
        }
    }
    #endif

    return "/usr/local";
}